

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O2

void InitializeCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  if (PAL_InitializeChakraCoreCalled) {
    CorUnix::InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection,0,false);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void InitializeCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(InitializeCriticalSection);
    ENTRY("InitializeCriticalSection(lpCriticalSection=%p)\n",
          lpCriticalSection);

    InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection,
                                                  0, false);

    LOGEXIT("InitializeCriticalSection returns void\n");
    PERF_EXIT(InitializeCriticalSection);
}